

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  undefined1 n [16];
  format_specs specs;
  num_writer f;
  bool bVar2;
  char cVar3;
  bool bVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  undefined8 uVar11;
  reference pcVar12;
  char *pcVar13;
  long in_RDI;
  string_view sVar14;
  const_iterator group;
  int size;
  int num_digits;
  wchar_t sep;
  string groups;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe78;
  locale_ref in_stack_fffffffffffffe80;
  locale_ref in_stack_fffffffffffffe88;
  int in_stack_ffffffffffffff2c;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff5c;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *in_stack_ffffffffffffff60;
  undefined1 auVar15 [12];
  undefined4 in_stack_ffffffffffffff90;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined4 in_stack_ffffffffffffffa8;
  string local_28 [40];
  
  grouping<wchar_t>(in_stack_fffffffffffffe88);
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    wVar5 = thousands_sep<wchar_t>(in_stack_fffffffffffffe80);
    if (wVar5 == L'\0') {
      on_dec(in_stack_ffffffffffffff60);
    }
    else {
      uVar16 = *(undefined8 *)(in_RDI + 0x10);
      uVar17 = *(undefined8 *)(in_RDI + 0x18);
      n._8_8_ = in_stack_fffffffffffffe88.locale_;
      n._0_8_ = in_stack_fffffffffffffe80.locale_;
      iVar6 = count_digits((uint128_t)n);
      iVar7 = iVar6;
      _Var10._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        uVar11 = std::__cxx11::string::cend();
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffe80.locale_,in_stack_fffffffffffffe78);
        bVar4 = false;
        if (bVar2) {
          iVar8 = iVar7;
          pcVar12 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&stack0xffffffffffffff88);
          bVar4 = false;
          bVar2 = *pcVar12 < iVar7;
          iVar7 = iVar8;
          if (bVar2) {
            pcVar12 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&stack0xffffffffffffff88);
            bVar4 = false;
            iVar7 = iVar8;
            if ('\0' < *pcVar12) {
              pcVar12 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&stack0xffffffffffffff88);
              cVar1 = *pcVar12;
              cVar3 = max_value<char>();
              bVar4 = cVar1 != cVar3;
              iVar7 = iVar8;
            }
          }
        }
        if (!bVar4) break;
        iVar6 = iVar6 + 1;
        pcVar12 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&stack0xffffffffffffff88);
        iVar7 = iVar7 - *pcVar12;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xffffffffffffff88);
      }
      std::__cxx11::string::cend();
      bVar4 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffe80.locale_,in_stack_fffffffffffffe78);
      if (bVar4) {
        iVar8 = iVar7 + -1;
        pcVar13 = (char *)std::__cxx11::string::back();
        iVar6 = iVar8 / (int)*pcVar13 + iVar6;
      }
      sVar14 = get_prefix((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *)
                          0x1bdf2b);
      auVar15 = sVar14._0_12_;
      specs.fill.data_[0] = in_stack_ffffffffffffff5c;
      specs._0_12_ = *(undefined1 (*) [12])&(*(string_view **)(in_RDI + 8))[1].size_;
      specs.fill.data_._4_8_ = in_stack_ffffffffffffff60;
      specs.fill.data_[3] = auVar15._0_4_;
      specs.fill.data_[4] = auVar15._4_4_;
      specs.fill.data_[5] = auVar15._8_4_;
      f.abs_value._8_8_ = _Var10._M_current;
      f.abs_value._0_8_ = uVar11;
      f.size = in_stack_ffffffffffffff90;
      f._20_4_ = iVar6;
      f.groups = (string *)uVar16;
      f._32_8_ = uVar17;
      f._40_4_ = in_stack_ffffffffffffffa8;
      f._44_4_ = iVar7;
      basic_writer<fmt::v6::buffer_range<wchar_t>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::num_writer>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,**(string_view **)(in_RDI + 8),
                 specs,f);
    }
  }
  else {
    on_dec(in_stack_ffffffffffffff60);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }